

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_locate(REF_INTERP ref_interp)

{
  REF_INT *pRVar1;
  size_t __size;
  int node;
  REF_MPI ref_mpi;
  REF_GRID pRVar2;
  REF_GRID ref_grid;
  REF_NODE pRVar3;
  REF_NODE pRVar4;
  REF_DBL *pRVar5;
  uint *puVar6;
  uint uVar7;
  REF_MPI ref_mpi_00;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  REF_INT *pRVar11;
  undefined8 uVar12;
  long lVar13;
  REF_DBL *pRVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  REF_INT RVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  ulong uVar22;
  REF_INT total_node;
  REF_INT *local_e0;
  REF_NODE local_d8;
  REF_BOOL increase_fuzz;
  undefined4 uStack_cc;
  REF_INT *local_c8;
  void *local_c0;
  REF_DBL *local_b8;
  REF_GRID local_b0;
  REF_MPI local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  REF_INT *source;
  REF_DBL *global_xyz;
  REF_LIST from_geom_list;
  REF_INT nrecv;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  void *local_38;
  
  ref_mpi = ref_interp->ref_mpi;
  ref_mpi_00 = ref_mpi;
  if (ref_interp->instrument != 0) {
    uVar7 = ref_mpi_stopwatch_start(ref_mpi);
    if (uVar7 != 0) {
      uVar22 = (ulong)uVar7;
      pcVar15 = "locate clock";
      uVar12 = 0x6ba;
      goto LAB_0015ca16;
    }
    ref_mpi_00 = ref_interp->ref_mpi;
  }
  pRVar2 = ref_interp->from_grid;
  ref_grid = ref_interp->to_grid;
  pRVar3 = ref_grid->node;
  pRVar4 = pRVar2->node;
  local_a8 = ref_mpi;
  uVar7 = ref_list_create((REF_LIST *)&increase_fuzz);
  if (uVar7 == 0) {
    local_d8 = pRVar4;
    local_b0 = pRVar2;
    uVar7 = ref_list_create(&from_geom_list);
    if (uVar7 != 0) {
      uVar22 = (ulong)uVar7;
      pcVar15 = "create list";
      uVar12 = 0x3ee;
      goto LAB_0015c9ee;
    }
    uVar7 = ref_interp_geom_node_list(ref_grid,(REF_LIST)CONCAT44(uStack_cc,increase_fuzz));
    if (uVar7 != 0) {
      uVar22 = (ulong)uVar7;
      pcVar15 = "to list";
      uVar12 = 0x3ef;
      goto LAB_0015c9ee;
    }
    uVar7 = ref_interp_geom_node_list(local_b0,from_geom_list);
    if (uVar7 != 0) {
      uVar22 = (ulong)uVar7;
      pcVar15 = "from list";
      uVar12 = 0x3f0;
      goto LAB_0015c9ee;
    }
    puVar6 = (uint *)CONCAT44(uStack_cc,increase_fuzz);
    uVar22 = (ulong)*puVar6;
    if ((int)*puVar6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x3f2,"ref_interp_geom_nodes","malloc local_node of REF_INT negative");
      uVar22 = 1;
      goto LAB_0015c9f5;
    }
    pvVar8 = malloc(uVar22 * 4);
    if (pvVar8 == (void *)0x0) {
      pcVar15 = "malloc local_node of REF_INT NULL";
      uVar12 = 0x3f2;
LAB_0015cb9f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar12,"ref_interp_geom_nodes",pcVar15);
      uVar22 = 2;
    }
    else {
      local_88 = pvVar8;
      pvVar8 = malloc(uVar22 * 0x18);
      if (pvVar8 == (void *)0x0) {
        pcVar15 = "malloc local_xyz of REF_DBL NULL";
        uVar12 = 0x3f3;
        goto LAB_0015cb9f;
      }
      pRVar14 = (REF_DBL *)((long)pvVar8 + 0x10);
      for (lVar9 = 0; lVar9 < (int)uVar22; lVar9 = lVar9 + 1) {
        iVar19 = *(int *)(*(long *)(puVar6 + 2) + lVar9 * 4);
        lVar13 = (long)iVar19;
        *(int *)((long)local_88 + lVar9 * 4) = iVar19;
        pRVar5 = pRVar3->real;
        pRVar14[-2] = pRVar5[lVar13 * 0xf];
        pRVar14[-1] = pRVar5[lVar13 * 0xf + 1];
        *pRVar14 = pRVar5[lVar13 * 0xf + 2];
        uVar22 = (ulong)*puVar6;
        pRVar14 = pRVar14 + 3;
      }
      uVar7 = ref_mpi_allconcat(ref_mpi_00,3,(int)uVar22,pvVar8,&total_node,&source,&global_xyz,3);
      if (uVar7 != 0) {
        uVar22 = (ulong)uVar7;
        pcVar15 = "cat";
        uVar12 = 0x3fe;
        goto LAB_0015c9ee;
      }
      local_38 = pvVar8;
      free(source);
      uVar22 = 1;
      uVar7 = ref_mpi_allconcat(ref_mpi_00,1,*(REF_INT *)CONCAT44(uStack_cc,increase_fuzz),local_88,
                                &total_node,&source,&global_node,1);
      RVar18 = total_node;
      if (uVar7 == 0) {
        lVar9 = (long)total_node;
        if (-1 < lVar9) {
          local_b8 = (REF_DBL *)malloc(lVar9 * 8);
          if (local_b8 == (REF_DBL *)0x0) {
            pcVar15 = "malloc best_dist of REF_DBL NULL";
            uVar12 = 0x405;
          }
          else {
            local_c0 = malloc(lVar9 * 4);
            if (local_c0 == (void *)0x0) {
              pcVar15 = "malloc best_node of REF_INT NULL";
              uVar12 = 0x406;
            }
            else {
              local_c8 = (REF_INT *)malloc(lVar9 * 4);
              if (local_c8 == (REF_INT *)0x0) {
                pcVar15 = "malloc from_proc of REF_INT NULL";
                uVar12 = 0x407;
              }
              else {
                for (lVar13 = 0; lVar13 != lVar9; lVar13 = lVar13 + 1) {
                  *(undefined4 *)((long)local_c0 + lVar13 * 4) = 0xffffffff;
                  local_b8[lVar13] = 1e+20;
                  uVar7 = from_geom_list->n;
                  if (from_geom_list->n < 1) {
                    uVar7 = 0;
                  }
                  dVar20 = 1e+20;
                  for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
                    iVar19 = from_geom_list->value[uVar16];
                    lVar17 = (long)iVar19;
                    pRVar14 = local_d8->real;
                    dVar21 = SQRT((global_xyz[lVar13 * 3 + 2] - pRVar14[lVar17 * 0xf + 2]) *
                                  (global_xyz[lVar13 * 3 + 2] - pRVar14[lVar17 * 0xf + 2]) +
                                  (global_xyz[lVar13 * 3 + 1] - pRVar14[lVar17 * 0xf + 1]) *
                                  (global_xyz[lVar13 * 3 + 1] - pRVar14[lVar17 * 0xf + 1]) +
                                  (global_xyz[lVar13 * 3] - pRVar14[lVar17 * 0xf]) *
                                  (global_xyz[lVar13 * 3] - pRVar14[lVar17 * 0xf]));
                    if ((uVar16 == 0) || (dVar21 < dVar20)) {
                      local_b8[lVar13] = dVar21;
                      *(int *)((long)local_c0 + lVar13 * 4) = iVar19;
                      dVar20 = dVar21;
                    }
                  }
                }
                uVar7 = ref_mpi_allminwho(ref_mpi_00,local_b8,local_c8,RVar18);
                RVar18 = total_node;
                if (uVar7 != 0) {
                  pcVar15 = "who";
                  uVar12 = 0x419;
                  goto LAB_0015cc1d;
                }
                uVar16 = 0;
                uVar10 = 0;
                if (0 < total_node) {
                  uVar10 = (ulong)(uint)total_node;
                }
                uVar7 = 0;
                for (; uVar10 != uVar16; uVar16 = uVar16 + 1) {
                  uVar7 = uVar7 + (ref_mpi_00->id == local_c8[uVar16]);
                }
                local_90 = malloc((ulong)(uVar7 * 4) << 3);
                if (local_90 == (void *)0x0) {
                  pcVar15 = "malloc send_bary of REF_DBL NULL";
                  uVar12 = 0x41f;
                }
                else {
                  __size = (ulong)uVar7 * 4;
                  local_98 = malloc(__size);
                  if (local_98 == (void *)0x0) {
                    pcVar15 = "malloc send_cell of REF_INT NULL";
                    uVar12 = 0x420;
                  }
                  else {
                    local_a0 = malloc(__size);
                    if (local_a0 == (void *)0x0) {
                      pcVar15 = "malloc send_node of REF_INT NULL";
                      uVar12 = 0x421;
                    }
                    else {
                      local_e0 = (REF_INT *)malloc(__size);
                      if (local_e0 == (REF_INT *)0x0) {
                        pcVar15 = "malloc send_proc of REF_INT NULL";
                        uVar12 = 0x422;
                      }
                      else {
                        local_d8 = (REF_NODE)malloc(__size);
                        if (local_d8 != (REF_NODE)0x0) {
                          for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
                            (&local_d8->n)[uVar16] = ref_mpi_00->id;
                          }
                          lVar13 = 0;
                          iVar19 = 0;
                          for (lVar9 = 0; lVar9 < RVar18; lVar9 = lVar9 + 1) {
                            if (ref_mpi_00->id == local_c8[lVar9]) {
                              node = *(int *)((long)local_c0 + lVar9 * 4);
                              if (node == -1) {
                                pcVar15 = "no geom node";
                                uVar12 = 0x428;
                                goto LAB_0015cd9e;
                              }
                              lVar17 = (long)iVar19;
                              *(REF_INT *)((long)local_a0 + lVar17 * 4) = global_node[lVar9];
                              local_e0[lVar17] = source[lVar9];
                              pRVar1 = (REF_INT *)((long)local_98 + lVar17 * 4);
                              pRVar14 = (REF_DBL *)((long)local_90 + (long)(iVar19 * 4) * 8);
                              if (local_b0->twod == 0) {
                                uVar7 = ref_interp_exhaustive_tet_around_node
                                                  (ref_interp,node,
                                                   (REF_DBL *)((long)global_xyz + lVar13),pRVar1,
                                                   pRVar14);
                                if (uVar7 != 0) {
                                  pcVar15 = "tet around node";
                                  uVar12 = 0x435;
                                  goto LAB_0015d291;
                                }
                              }
                              else {
                                uVar7 = ref_interp_exhaustive_tri_around_node
                                                  (ref_interp,node,
                                                   (REF_DBL *)((long)global_xyz + lVar13),pRVar1,
                                                   pRVar14);
                                if (uVar7 != 0) {
                                  pcVar15 = "tri around node";
                                  uVar12 = 0x430;
                                  goto LAB_0015d291;
                                }
                              }
                              iVar19 = iVar19 + 1;
                              RVar18 = total_node;
                            }
                            lVar13 = lVar13 + 0x18;
                          }
                          uVar7 = ref_mpi_blindsend(ref_mpi_00,local_e0,local_a0,1,iVar19,&recv_node
                                                    ,&nrecv,1);
                          if (uVar7 == 0) {
                            uVar7 = ref_mpi_blindsend(ref_mpi_00,local_e0,local_98,1,iVar19,
                                                      &recv_cell,&nrecv,1);
                            if (uVar7 == 0) {
                              uVar22 = 1;
                              uVar7 = ref_mpi_blindsend(ref_mpi_00,local_e0,local_d8,1,iVar19,
                                                        &recv_proc,&nrecv,1);
                              if (uVar7 == 0) {
                                uVar7 = ref_mpi_blindsend(ref_mpi_00,local_e0,local_90,4,iVar19,
                                                          &local_80,&nrecv,3);
                                if (uVar7 == 0) {
                                  pRVar1 = &ref_interp->n_geom_fail;
                                  local_b0 = (REF_GRID)&ref_interp->n_geom;
                                  lVar9 = 0;
                                  for (lVar13 = 0; lVar13 < nrecv; lVar13 = lVar13 + 1) {
                                    dVar20 = ref_interp->inside;
                                    if ((((*(double *)((long)local_80 + lVar13 * 0x20) <= dVar20) ||
                                         (*(double *)((long)local_80 + lVar13 * 0x20 + 8) <= dVar20)
                                         ) || (*(double *)((long)local_80 + lVar13 * 0x20 + 0x10) <=
                                               dVar20)) ||
                                       (*(double *)((long)local_80 + lVar13 * 0x20 + 0x18) <= dVar20
                                       )) {
                                      *pRVar1 = *pRVar1 + 1;
                                    }
                                    else {
                                      ref_interp->n_geom = ref_interp->n_geom + 1;
                                      iVar19 = recv_node[lVar13];
                                      pRVar11 = ref_interp->cell;
                                      if ((long)pRVar11[iVar19] != -1) {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0x44e,"ref_interp_geom_nodes","geom already found?",
                                               0xffffffffffffffff,(long)pRVar11[iVar19]);
                                        goto LAB_0015c9f5;
                                      }
                                      if (ref_interp->agent_hired[iVar19] != 0) {
                                        uVar7 = ref_agents_delete(ref_interp->ref_agents,iVar19);
                                        if (uVar7 != 0) {
                                          uVar22 = (ulong)uVar7;
                                          pcVar15 = "deq";
                                          uVar12 = 0x450;
                                          goto LAB_0015c9ee;
                                        }
                                        ref_interp->agent_hired[iVar19] = 0;
                                        pRVar11 = ref_interp->cell;
                                      }
                                      pRVar11[iVar19] = recv_cell[lVar13];
                                      ref_interp->part[iVar19] = recv_proc[lVar13];
                                      pRVar14 = ref_interp->bary;
                                      for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
                                        pRVar14[iVar19 * 4 + lVar17] =
                                             *(REF_DBL *)((long)local_80 + lVar17 * 8 + lVar9);
                                      }
                                      uVar7 = ref_interp_push_onto_queue(ref_interp,iVar19);
                                      if (uVar7 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0x457,"ref_interp_geom_nodes",(ulong)uVar7,"push");
                                        uVar22 = (ulong)uVar7;
                                        goto LAB_0015c9f5;
                                      }
                                    }
                                    lVar9 = lVar9 + 0x20;
                                  }
                                  uVar7 = ref_mpi_allsum(ref_mpi_00,local_b0,1,1);
                                  if (uVar7 == 0) {
                                    uVar7 = ref_mpi_allsum(ref_mpi_00,pRVar1,1,1);
                                    if (uVar7 == 0) {
                                      free(recv_node);
                                      free(recv_cell);
                                      free(recv_proc);
                                      free(local_80);
                                      free(local_90);
                                      free(local_d8);
                                      free(local_98);
                                      free(local_a0);
                                      free(local_e0);
                                      free(local_c8);
                                      free(local_c0);
                                      free(local_b8);
                                      free(source);
                                      free(global_node);
                                      free(global_xyz);
                                      free(local_38);
                                      free(local_88);
                                      ref_list_free(from_geom_list);
                                      ref_list_free((REF_LIST)CONCAT44(uStack_cc,increase_fuzz));
                                      if ((ref_interp->instrument == 0) ||
                                         (uVar7 = ref_mpi_stopwatch_stop(local_a8,"geom"),
                                         uVar7 == 0)) {
                                        uVar7 = ref_interp_process_agents(ref_interp);
                                        if (uVar7 == 0) {
                                          if ((ref_interp->instrument == 0) ||
                                             (uVar7 = ref_mpi_stopwatch_stop(local_a8,"drain"),
                                             uVar7 == 0)) {
                                            increase_fuzz = 0;
                                            iVar19 = 0xd;
                                            while( true ) {
                                              iVar19 = iVar19 + -1;
                                              if (iVar19 == 0) {
                                                if (increase_fuzz != 0) {
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x6d1,"ref_interp_locate",
                                                  "unable to grow fuzz to find tree candidate",0,
                                                  (long)increase_fuzz);
                                                  return 1;
                                                }
                                                return 0;
                                              }
                                              if ((increase_fuzz != 0) &&
                                                 (ref_interp->search_fuzz =
                                                       ref_interp->search_fuzz * 10.0,
                                                 local_a8->id == 0)) {
                                                printf("retry tree search with %e fuzz\n");
                                              }
                                              uVar7 = ref_interp_tree(ref_interp,&increase_fuzz);
                                              if (uVar7 != 0) break;
                                              if ((ref_interp->instrument != 0) &&
                                                 (uVar7 = ref_mpi_stopwatch_stop(local_a8,"tree"),
                                                 uVar7 != 0)) {
                                                uVar22 = (ulong)uVar7;
                                                pcVar15 = "locate clock";
                                                uVar12 = 0x6ce;
                                                goto LAB_0015ca16;
                                              }
                                              if (increase_fuzz == 0) {
                                                return 0;
                                              }
                                            }
                                            uVar22 = (ulong)uVar7;
                                            pcVar15 = "tree";
                                            uVar12 = 0x6cc;
                                          }
                                          else {
                                            uVar22 = (ulong)uVar7;
                                            pcVar15 = "locate clock";
                                            uVar12 = 0x6c2;
                                          }
                                        }
                                        else {
                                          uVar22 = (ulong)uVar7;
                                          pcVar15 = "drain";
                                          uVar12 = 0x6c0;
                                        }
                                      }
                                      else {
                                        uVar22 = (ulong)uVar7;
                                        pcVar15 = "locate clock";
                                        uVar12 = 0x6be;
                                      }
                                      goto LAB_0015ca16;
                                    }
                                    uVar22 = (ulong)uVar7;
                                    pcVar15 = "as";
                                    uVar12 = 0x45f;
                                  }
                                  else {
                                    uVar22 = (ulong)uVar7;
                                    pcVar15 = "as";
                                    uVar12 = 0x45d;
                                  }
                                  goto LAB_0015c9ee;
                                }
                                pcVar15 = "blind send bary";
                                uVar12 = 0x445;
                              }
                              else {
                                pcVar15 = "blind send proc";
                                uVar12 = 0x442;
                              }
LAB_0015d291:
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,uVar12,"ref_interp_geom_nodes",(ulong)uVar7,pcVar15);
                              uVar22 = (ulong)uVar7;
                              goto LAB_0015c9f5;
                            }
                            uVar22 = (ulong)uVar7;
                            pcVar15 = "blind send cell";
                            uVar12 = 0x43f;
                          }
                          else {
                            uVar22 = (ulong)uVar7;
                            pcVar15 = "blind send node";
                            uVar12 = 0x43c;
                          }
                          goto LAB_0015c9ee;
                        }
                        pcVar15 = "malloc my_proc of REF_INT NULL";
                        uVar12 = 0x423;
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0015cb9f;
        }
        pcVar15 = "malloc best_dist of REF_DBL negative";
        uVar12 = 0x405;
LAB_0015cd9e:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar12,"ref_interp_geom_nodes",pcVar15);
      }
      else {
        pcVar15 = "cat";
        uVar12 = 0x403;
LAB_0015cc1d:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar12,"ref_interp_geom_nodes",(ulong)uVar7,pcVar15);
        uVar22 = (ulong)uVar7;
      }
    }
  }
  else {
    uVar22 = (ulong)uVar7;
    pcVar15 = "create list";
    uVar12 = 0x3ed;
LAB_0015c9ee:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar12
           ,"ref_interp_geom_nodes",uVar22,pcVar15);
  }
LAB_0015c9f5:
  pcVar15 = "geom nodes";
  uVar12 = 0x6bc;
LAB_0015ca16:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar12,
         "ref_interp_locate",uVar22,pcVar15);
  return (REF_STATUS)uVar22;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_BOOL increase_fuzz;
  REF_INT tries;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_geom_nodes(ref_interp), "geom nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "geom"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}